

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O1

Vec_Int_t * assignRandomBitsToCells(Abc_Ntk_t *pNtk,coloring *c)

{
  uint uVar1;
  Vec_Int_t *p;
  int *piVar2;
  int iVar3;
  
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 0x10;
  p->nSize = 0;
  piVar2 = (int *)malloc(0x40);
  p->pArray = piVar2;
  if (0 < pNtk->vPis->nSize) {
    iVar3 = 0;
    do {
      rand();
      rand();
      uVar1 = rand();
      Vec_IntPush(p,uVar1 & 1);
      iVar3 = iVar3 + c->clen[(long)pNtk->vPos->nSize + (long)iVar3] + 1;
    } while (iVar3 < pNtk->vPis->nSize);
  }
  return p;
}

Assistant:

static Vec_Int_t * 
assignRandomBitsToCells(Abc_Ntk_t * pNtk, struct coloring *c)
{
    Vec_Int_t * randVec = Vec_IntAlloc( 1 );
    int i, bit;

    for (i = 0; i < Abc_NtkPiNum(pNtk); i += (c->clen[i+Abc_NtkPoNum(pNtk)]+1)) {
        bit = (int)(SIM_RANDOM_UNSIGNED % 2);
        Vec_IntPush(randVec, bit);
    }

    return randVec;
}